

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O3

int Abc_NtkEliminate1One(Abc_Ntk_t *pNtk,int ElimValue,int nMaxSize,int fReverse,int fVerbose)

{
  size_t __size;
  Abc_Obj_t *pNode;
  void *pvVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *__ptr;
  int *pPermFanin;
  int *pPermFanout;
  Vec_Ptr_t *vFanins;
  void **__ptr_00;
  Vec_Ptr_t *vNodes;
  void **ppvVar4;
  Abc_Obj_t *pAVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  if (nMaxSize < 1) {
    __assert_fail("nMaxSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcMinBase.c"
                  ,0x260,"int Abc_NtkEliminate1One(Abc_Ntk_t *, int, int, int, int)");
  }
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcMinBase.c"
                  ,0x261,"int Abc_NtkEliminate1One(Abc_Ntk_t *, int, int, int, int)");
  }
  iVar2 = Abc_NtkToAig(pNtk);
  if (iVar2 == 0) {
    fwrite("Converting to AIG has failed.\n",0x1e,1,_stdout);
    iVar2 = 0;
  }
  else {
    if (fReverse == 0) {
      __ptr = Abc_NtkDfs(pNtk,0);
    }
    else {
      __ptr = Abc_NtkDfsReverse(pNtk);
    }
    __size = (ulong)(uint)nMaxSize * 4 + 4000;
    pPermFanin = (int *)malloc(__size);
    pPermFanout = (int *)malloc(__size);
    vFanins = (Vec_Ptr_t *)malloc(0x10);
    vFanins->nCap = 1000;
    vFanins->nSize = 0;
    __ptr_00 = (void **)malloc(8000);
    vFanins->pArray = __ptr_00;
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 1000;
    vNodes->nSize = 0;
    ppvVar4 = (void **)malloc(8000);
    vNodes->pArray = ppvVar4;
    if (0 < __ptr->nSize) {
      lVar7 = 0;
      do {
        pNode = (Abc_Obj_t *)__ptr->pArray[lVar7];
        if (((((*(uint *)&pNode->field_0x14 & 0xf) == 7) &&
             (pAVar5 = Abc_NodeFindCoFanout(pNode), pAVar5 == (Abc_Obj_t *)0x0)) &&
            ((pNode->vFanins).nSize <= nMaxSize)) &&
           ((iVar2 = Abc_NodeIsExor(pNode), iVar2 == 0 &&
            (iVar2 = Abc_NodeCountAppearancesAll(pNode), iVar2 <= ElimValue + 2)))) {
          iVar2 = (pNode->vFanouts).nSize;
          lVar8 = 0;
          if (0 < iVar2) {
            do {
              iVar3 = Abc_NodeCollapseSuppSize
                                (pNode,(Abc_Obj_t *)
                                       pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar8]],
                                 vFanins);
              iVar2 = (pNode->vFanouts).nSize;
              if (nMaxSize < iVar3) break;
              lVar8 = lVar8 + 1;
            } while (lVar8 < iVar2);
          }
          if ((iVar2 <= (int)lVar8) && (Abc_NodeCollectFanouts(pNode,vNodes), 0 < vNodes->nSize)) {
            lVar8 = 0;
            do {
              pAVar5 = (Abc_Obj_t *)vNodes->pArray[lVar8];
              if (fVerbose == 0) {
                iVar2 = Abc_NodeCollapse1(pNode,pAVar5,vFanins,pPermFanin,pPermFanout);
                if (iVar2 == 0) goto LAB_008632d8;
              }
              else {
                printf("Collapsing fanin %5d (supp =%2d) into fanout %5d (supp =%2d) ",
                       (ulong)(uint)pNode->Id,(ulong)(uint)(pNode->vFanins).nSize,
                       (ulong)(uint)pAVar5->Id,(ulong)(uint)(pAVar5->vFanins).nSize);
                iVar2 = Abc_NodeCollapse1(pNode,pAVar5,vFanins,pPermFanin,pPermFanout);
                if (iVar2 == 0) {
LAB_008632d8:
                  __assert_fail("RetValue",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcMinBase.c"
                                ,0x28c,"int Abc_NtkEliminate1One(Abc_Ntk_t *, int, int, int, int)");
                }
                lVar6 = (long)pNtk->vObjs->nSize;
                if (lVar6 < 1) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                pvVar1 = pNtk->vObjs->pArray[lVar6 + -1];
                if (pvVar1 != (void *)0x0) {
                  printf("resulting in node %5d (supp =%2d).\n",
                         (ulong)*(uint *)((long)pvVar1 + 0x10),(ulong)*(uint *)((long)pvVar1 + 0x1c)
                        );
                }
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < vNodes->nSize);
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < __ptr->nSize);
      __ptr_00 = vFanins->pArray;
    }
    if (__ptr_00 != (void **)0x0) {
      free(__ptr_00);
    }
    free(vFanins);
    if (vNodes->pArray != (void **)0x0) {
      free(vNodes->pArray);
    }
    free(vNodes);
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    if (pPermFanin != (int *)0x0) {
      free(pPermFanin);
    }
    iVar2 = 1;
    if (pPermFanout != (int *)0x0) {
      free(pPermFanout);
    }
  }
  return iVar2;
}

Assistant:

int Abc_NtkEliminate1One( Abc_Ntk_t * pNtk, int ElimValue, int nMaxSize, int fReverse, int fVerbose )
{
    Vec_Ptr_t * vFanouts, * vFanins, * vNodes;
    Abc_Obj_t * pNode, * pFanout;
    int * pPermFanin, * pPermFanout;
    int RetValue, i, k;
    assert( nMaxSize > 0 );
    assert( Abc_NtkIsLogic(pNtk) ); 
    // convert network to BDD representation
    if ( !Abc_NtkToAig(pNtk) )
    {
        fprintf( stdout, "Converting to AIG has failed.\n" );
        return 0;
    }
    // get the nodes in the given order
    vNodes = fReverse? Abc_NtkDfsReverse( pNtk ) : Abc_NtkDfs( pNtk, 0 );
    // go through the nodes and decide is they can be eliminated
    pPermFanin = ABC_ALLOC( int, nMaxSize + 1000 );
    pPermFanout = ABC_ALLOC( int, nMaxSize + 1000 );
    vFanins = Vec_PtrAlloc( 1000 );
    vFanouts = Vec_PtrAlloc( 1000 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( !Abc_ObjIsNode(pNode) ) // skip deleted nodes
            continue;
        if ( Abc_NodeFindCoFanout(pNode) != NULL )
            continue;
        if ( Abc_ObjFaninNum(pNode) > nMaxSize )
            continue;
        if ( Abc_NodeIsExor(pNode) )
            continue;
        // skip nodes with more than one fanout
//        if ( Abc_ObjFanoutNum(pNode) != 1 ) 
//            continue;
        // skip nodes that appear in the FF of their fanout more than once
        if ( Abc_NodeCountAppearancesAll( pNode ) > ElimValue + 2 ) 
            continue;       
        Abc_ObjForEachFanout( pNode, pFanout, k )
            if ( Abc_NodeCollapseSuppSize(pNode, pFanout, vFanins) > nMaxSize )
                break;
        if ( k < Abc_ObjFanoutNum(pNode) )
            continue;
        // perform elimination
        Abc_NodeCollectFanouts( pNode, vFanouts );
        Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, k )
        {
            if ( fVerbose )
                printf( "Collapsing fanin %5d (supp =%2d) into fanout %5d (supp =%2d) ",
                    Abc_ObjId(pNode), Abc_ObjFaninNum(pNode), Abc_ObjId(pFanout), Abc_ObjFaninNum(pFanout) ); 
            RetValue = Abc_NodeCollapse1( pNode, pFanout, vFanins, pPermFanin, pPermFanout );
            assert( RetValue );
            if ( fVerbose )
            {
                Abc_Obj_t * pNodeNew = Abc_NtkObj( pNtk, Abc_NtkObjNumMax(pNtk) - 1 );
                if ( pNodeNew )
                    printf( "resulting in node %5d (supp =%2d).\n", Abc_ObjId(pNodeNew), Abc_ObjFaninNum(pNodeNew) );
            }
        }
    }
    Vec_PtrFree( vFanins );
    Vec_PtrFree( vFanouts );
    Vec_PtrFree( vNodes );
    ABC_FREE( pPermFanin );
    ABC_FREE( pPermFanout );
    return 1;
}